

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O0

unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
duckdb::HyperLogLog::Deserialize(Deserializer *deserializer)

{
  HLLV1 *this;
  HyperLogLog *new_hll;
  pointer pHVar1;
  SerializationException *this_00;
  char *in_RSI;
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_> in_RDI;
  templated_unique_single_t old;
  HLLStorageType storage_type;
  templated_unique_single_t *result;
  string *in_stack_ffffffffffffff38;
  unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *in_stack_ffffffffffffff40;
  data_ptr_t in_stack_ffffffffffffff48;
  allocator *paVar2;
  Deserializer *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffff60;
  allocator local_51;
  string local_50 [62];
  HLLStorageType local_12;
  undefined1 local_11;
  char *local_10;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff58 >> 0x30);
  local_11 = 0;
  local_10 = in_RSI;
  make_uniq<duckdb::HyperLogLog>();
  local_12 = Deserializer::ReadProperty<duckdb::HLLStorageType>
                       (in_stack_ffffffffffffff50,
                        (field_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                        (char *)in_stack_ffffffffffffff40);
  if (local_12 == HLL_V1) {
    make_uniq<duckdb::HLLV1>();
    unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
              (in_stack_ffffffffffffff40);
    HLLV1::GetPtr((HLLV1 *)0x2bb04d0);
    unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
              (in_stack_ffffffffffffff40);
    this = (HLLV1 *)HLLV1::GetSize();
    Deserializer::ReadProperty
              (in_stack_ffffffffffffff60,field_id,(char *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40);
    new_hll = (HyperLogLog *)
              unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::operator->
                        (in_stack_ffffffffffffff40);
    unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::operator*
              ((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> *)
               in_stack_ffffffffffffff40);
    HLLV1::ToNew(this,new_hll);
    unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true>::~unique_ptr
              ((unique_ptr<duckdb::HLLV1,_std::default_delete<duckdb::HLLV1>,_true> *)0x2bb0557);
  }
  else {
    if (local_12 != HLL_V2) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      paVar2 = &local_51;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_50,"Unknown HyperLogLog storage type!",paVar2);
      SerializationException::SerializationException(this_00,in_stack_ffffffffffffff38);
      __cxa_throw(this_00,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    pHVar1 = unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::
             operator->((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                         *)in_stack_ffffffffffffff40);
    Deserializer::ReadProperty
              (in_stack_ffffffffffffff60,(field_id_t)((ulong)pHVar1 >> 0x30),local_10,
               in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40);
  }
  return (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
         (__uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
         super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<HyperLogLog> HyperLogLog::Deserialize(Deserializer &deserializer) {
	auto result = make_uniq<HyperLogLog>();
	auto storage_type = deserializer.ReadProperty<HLLStorageType>(100, "type");
	switch (storage_type) {
	case HLLStorageType::HLL_V1: {
		auto old = make_uniq<HLLV1>();
		deserializer.ReadProperty(101, "data", old->GetPtr(), old->GetSize());
		old->ToNew(*result);
		break;
	}
	case HLLStorageType::HLL_V2:
		deserializer.ReadProperty(101, "data", result->k, sizeof(k));
		break;
	default:
		throw SerializationException("Unknown HyperLogLog storage type!");
	}
	return result;
}